

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O0

_Bool str_to_usize(char *string,size_t *out)

{
  int *piVar1;
  uintmax_t uVar2;
  bool bVar3;
  bool bVar4;
  byte local_3c;
  _Bool result;
  _Bool failed;
  _Bool out_of_range;
  uintmax_t conv_ret_val;
  char *endptr;
  _Bool is_negated;
  ulong uStack_20;
  int base;
  size_t len;
  size_t *out_local;
  char *string_local;
  
  len = (size_t)out;
  out_local = (size_t *)string;
  uStack_20 = strlen(string);
  endptr._4_4_ = 10;
  endptr._3_1_ = false;
  if ((uStack_20 != 0) && (((char)*out_local == '-' || ((char)*out_local == '+')))) {
    endptr._3_1_ = (char)*out_local == '-';
    uStack_20 = uStack_20 - 1;
    out_local = (size_t *)((long)out_local + 1);
  }
  if (((uStack_20 < 2) || ((char)*out_local != '0')) || (*(char *)((long)out_local + 1) != 'x')) {
    if (((1 < uStack_20) && ((char)*out_local == '0')) && (*(char *)((long)out_local + 1) == 'b')) {
      endptr._4_4_ = 2;
      out_local = (size_t *)((long)out_local + 2);
      uStack_20 = uStack_20 - 2;
    }
  }
  else {
    endptr._4_4_ = 0x10;
    out_local = (size_t *)((long)out_local + 2);
    uStack_20 = uStack_20 - 2;
  }
  conv_ret_val = 0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = strtoumax((char *)out_local,(char **)&conv_ret_val,endptr._4_4_);
  piVar1 = __errno_location();
  local_3c = 1;
  if (*piVar1 != 0x22) {
    local_3c = endptr._3_1_;
  }
  bVar3 = true;
  if (((uStack_20 != 0) && (bVar3 = true, (local_3c & 1) == 0)) &&
     (bVar3 = true, (size_t *)conv_ret_val != out_local)) {
    bVar3 = conv_ret_val == 0;
  }
  bVar4 = false;
  if (!bVar3) {
    bVar4 = *(char *)conv_ret_val == '\0';
  }
  if (bVar4) {
    *(uintmax_t *)len = uVar2;
  }
  else {
    *(undefined8 *)len = 0;
  }
  return bVar4;
}

Assistant:

bool str_to_usize(const char *string, size_t *out) {
    size_t len = strlen(string);
    int base = 10;

    bool is_negated = false;
    if (len >= 1 && (string[0] == '-' || string[0] == '+')) {
        is_negated = string[0] == '-';

        len -= 1;
        string += 1;
    }

    if (len >= 2 && string[0] == '0' && string[1] == 'x') {
        base = 16;
        string += 2;
        len -= 2;
    } else if (len >= 2 && string[0] == '0' && string[1] == 'b') {
        base = 2;
        string += 2;
        len -= 2;
    }

    STATIC_ASSERT(sizeof(uintmax_t) >= sizeof(size_t),
                  "These sizes should match so that we can use the correct "
                  "strtoXXX C function");

    char *endptr = NULL;
    errno = 0;
    uintmax_t conv_ret_val = strtoumax(string, &endptr, base);

    bool out_of_range =
        (errno == ERANGE) || (conv_ret_val > UINTMAX_MAX) || is_negated;

    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;
    bool result = !failed && *endptr == '\0';

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = 0;
    }

    return result;
}